

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
re2::DFA::Search(DFA *this,StringPiece *text,StringPiece *context,bool anchored,
                bool want_earliest_match,bool run_forward,bool *failed,char **epp,SparseSet *matches
                )

{
  bool bVar1;
  const_pointer pcVar2;
  byte in_CL;
  StringPiece *in_RDX;
  StringPiece *in_RSI;
  DFA *in_RDI;
  byte in_R8B;
  byte in_R9B;
  undefined1 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  SparseSet *in_stack_00000018;
  bool ret;
  SearchParams params;
  RWLocker l;
  SearchParams *in_stack_00000290;
  DFA *in_stack_00000298;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  RWLocker *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff28;
  DFA *this_00;
  SearchParams local_90;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined8 local_20;
  undefined8 local_18;
  undefined1 local_1;
  
  local_21 = in_CL & 1;
  local_22 = in_R8B & 1;
  local_23 = in_R9B & 1;
  *in_stack_00000010 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = ok(in_RDI);
  if (bVar1) {
    *in_stack_00000008 = 0;
    this_00 = (DFA *)&stack0xffffffffffffffc8;
    RWLocker::RWLocker(in_stack_ffffffffffffff10,
                       (Mutex *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    SearchParams::SearchParams
              (&local_90,(StringPiece *)local_18,(StringPiece *)local_20,(RWLocker *)this_00);
    local_90.anchored = (bool)(local_21 & 1);
    local_90.want_earliest_match = (bool)(local_22 & 1);
    local_90.run_forward = (bool)(local_23 & 1);
    local_90.matches = in_stack_00000018;
    bVar1 = AnalyzeSearch(in_stack_00000298,in_stack_00000290);
    if (bVar1) {
      if (local_90.start == (State *)0x1) {
        local_1 = false;
      }
      else if (local_90.start == (State *)0x2) {
        if ((local_23 & 1) == (local_22 & 1)) {
          pcVar2 = StringPiece::data((StringPiece *)local_18);
          *in_stack_00000010 = pcVar2;
        }
        else {
          pcVar2 = StringPiece::data((StringPiece *)local_18);
          in_stack_ffffffffffffff10 = (RWLocker *)StringPiece::size((StringPiece *)local_18);
          *in_stack_00000010 = pcVar2 + (long)in_stack_ffffffffffffff10;
        }
        local_1 = true;
      }
      else {
        local_1 = FastSearchLoop(this_00,(SearchParams *)CONCAT17(bVar1,in_stack_ffffffffffffff28));
        if ((local_90.failed & 1U) == 0) {
          *in_stack_00000010 = local_90.ep;
        }
        else {
          *in_stack_00000008 = 1;
          local_1 = false;
        }
      }
    }
    else {
      *in_stack_00000008 = 1;
      local_1 = false;
    }
    RWLocker::~RWLocker(in_stack_ffffffffffffff10);
  }
  else {
    *in_stack_00000008 = 1;
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DFA::Search(const StringPiece& text,
                 const StringPiece& context,
                 bool anchored,
                 bool want_earliest_match,
                 bool run_forward,
                 bool* failed,
                 const char** epp,
                 SparseSet* matches) {
  *epp = NULL;
  if (!ok()) {
    *failed = true;
    return false;
  }
  *failed = false;

  if (ExtraDebug) {
    fprintf(stderr, "\nprogram:\n%s\n", prog_->DumpUnanchored().c_str());
    fprintf(stderr, "text %s anchored=%d earliest=%d fwd=%d kind %d\n",
            std::string(text).c_str(), anchored, want_earliest_match,
            run_forward, kind_);
  }

  RWLocker l(&cache_mutex_);
  SearchParams params(text, context, &l);
  params.anchored = anchored;
  params.want_earliest_match = want_earliest_match;
  params.run_forward = run_forward;
  params.matches = matches;

  if (!AnalyzeSearch(&params)) {
    *failed = true;
    return false;
  }
  if (params.start == DeadState)
    return false;
  if (params.start == FullMatchState) {
    if (run_forward == want_earliest_match)
      *epp = text.data();
    else
      *epp = text.data() + text.size();
    return true;
  }
  if (ExtraDebug)
    fprintf(stderr, "start %s\n", DumpState(params.start).c_str());
  bool ret = FastSearchLoop(&params);
  if (params.failed) {
    *failed = true;
    return false;
  }
  *epp = params.ep;
  return ret;
}